

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

void __thiscall draco::ObjEncoder::EncodeInt(ObjEncoder *this,int32_t val)

{
  char *__s;
  EncoderBuffer *this_00;
  size_t data_size;
  
  __s = this->num_buffer_;
  snprintf(__s,0x14,"%d",val);
  this_00 = this->out_buffer_;
  data_size = strlen(__s);
  EncoderBuffer::Encode(this_00,__s,data_size);
  return;
}

Assistant:

void ObjEncoder::EncodeInt(int32_t val) {
  snprintf(num_buffer_, sizeof(num_buffer_), "%d", val);
  buffer()->Encode(num_buffer_, strlen(num_buffer_));
}